

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainComposite(Parse *pParse,int op,int iSub1,int iSub2,int bUseTmp)

{
  Vdbe *p;
  sqlite3 *db;
  char *pcVar1;
  char *pcVar2;
  char *zMsg;
  Vdbe *v;
  int bUseTmp_local;
  int iSub2_local;
  int iSub1_local;
  int op_local;
  Parse *pParse_local;
  
  if (pParse->explain == '\x02') {
    p = pParse->pVdbe;
    db = pParse->db;
    pcVar1 = "";
    if (bUseTmp != 0) {
      pcVar1 = "USING TEMP B-TREE ";
    }
    pcVar2 = selectOpName(op);
    pcVar1 = sqlite3MPrintf(db,"COMPOUND SUBQUERIES %d AND %d %s(%s)",(ulong)(uint)iSub1,
                            (ulong)(uint)iSub2,pcVar1,pcVar2);
    sqlite3VdbeAddOp4(p,0x96,pParse->iSelectId,0,0,pcVar1,-1);
  }
  return;
}

Assistant:

static void explainComposite(
  Parse *pParse,                  /* Parse context */
  int op,                         /* One of TK_UNION, TK_EXCEPT etc. */
  int iSub1,                      /* Subquery id 1 */
  int iSub2,                      /* Subquery id 2 */
  int bUseTmp                     /* True if a temp table was used */
){
  assert( op==TK_UNION || op==TK_EXCEPT || op==TK_INTERSECT || op==TK_ALL );
  if( pParse->explain==2 ){
    Vdbe *v = pParse->pVdbe;
    char *zMsg = sqlite3MPrintf(
        pParse->db, "COMPOUND SUBQUERIES %d AND %d %s(%s)", iSub1, iSub2,
        bUseTmp?"USING TEMP B-TREE ":"", selectOpName(op)
    );
    sqlite3VdbeAddOp4(v, OP_Explain, pParse->iSelectId, 0, 0, zMsg, P4_DYNAMIC);
  }
}